

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sinproc.c
# Opt level: O1

void nn_sinproc_term(nn_sinproc *self)

{
  nn_list_item_term(&self->item);
  nn_fsm_event_term(&self->event_disconnect);
  nn_fsm_event_term(&self->event_received);
  nn_fsm_event_term(&self->event_sent);
  nn_fsm_event_term(&self->event_connect);
  nn_msg_term(&self->msg);
  nn_msgqueue_term(&self->msgqueue);
  nn_pipebase_term(&self->pipebase);
  nn_fsm_term(&self->fsm);
  return;
}

Assistant:

void nn_sinproc_term (struct nn_sinproc *self)
{
    nn_list_item_term (&self->item);
    nn_fsm_event_term (&self->event_disconnect);
    nn_fsm_event_term (&self->event_received);
    nn_fsm_event_term (&self->event_sent);
    nn_fsm_event_term (&self->event_connect);
    nn_msg_term (&self->msg);
    nn_msgqueue_term (&self->msgqueue);
    nn_pipebase_term (&self->pipebase);
    nn_fsm_term (&self->fsm);
}